

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

Grammar * __thiscall
xercesc_4_0::IGXMLScanner::loadDTDGrammar(IGXMLScanner *this,InputSource *src,bool toCache)

{
  ReaderMgr *this_00;
  XMLValidator *pXVar1;
  XMLDocumentHandler *pXVar2;
  XMLEntityHandler *pXVar3;
  XMLErrorReporter *pXVar4;
  XMLStringPool *pXVar5;
  int iVar6;
  GrammarType GVar7;
  uint uVar8;
  int iVar9;
  DTDGrammar *pDVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLReader *reader;
  DTDEntityDecl *this_01;
  undefined4 extraout_var_01;
  DTDElementDecl *this_02;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  RuntimeException *this_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  DocTypeHandler *pDVar11;
  XMLCh gDTDStr [4];
  DTDScanner dtdScanner;
  
  (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  iVar6 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])();
  if ((char)iVar6 == '\0') {
    if (((this->super_XMLScanner).fValidatorFromUser == true) &&
       ((this->super_XMLScanner).fValidate == true)) {
      this_03 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_03,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                 ,0xbd4,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
      goto LAB_002a9836;
    }
    (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
  }
  pDVar10 = (DTDGrammar *)
            GrammarResolver::getGrammar
                      ((this->super_XMLScanner).fGrammarResolver,(XMLCh *)XMLUni::fgDTDEntityString)
  ;
  this->fDTDGrammar = pDVar10;
  if (pDVar10 == (DTDGrammar *)0x0) {
    pDVar10 = (DTDGrammar *)
              XMemory::operator_new(0x40,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    DTDGrammar::DTDGrammar(pDVar10,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    this->fDTDGrammar = pDVar10;
    GrammarResolver::putGrammar((this->super_XMLScanner).fGrammarResolver,(Grammar *)pDVar10);
  }
  else {
    (*(pDVar10->super_Grammar).super_XSerializable._vptr_XSerializable[0x14])(pDVar10);
  }
  pDVar10 = this->fDTDGrammar;
  (this->super_XMLScanner).fGrammar = &pDVar10->super_Grammar;
  GVar7 = (*(pDVar10->super_Grammar).super_XSerializable._vptr_XSerializable[5])();
  this->fGrammarType = GVar7;
  pXVar1 = (this->super_XMLScanner).fValidator;
  (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,(this->super_XMLScanner).fGrammar);
  pXVar2 = (this->super_XMLScanner).fDocHandler;
  if (pXVar2 != (XMLDocumentHandler *)0x0) {
    (*pXVar2->_vptr_XMLDocumentHandler[9])();
  }
  pXVar3 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar3 != (XMLEntityHandler *)0x0) {
    (*pXVar3->_vptr_XMLEntityHandler[4])();
  }
  pXVar4 = (this->super_XMLScanner).fErrorReporter;
  if (pXVar4 != (XMLErrorReporter *)0x0) {
    (*pXVar4->_vptr_XMLErrorReporter[3])();
  }
  XMLScanner::resetValidationContext(&this->super_XMLScanner);
  NameIdPool<xercesc_4_0::DTDElementDecl>::removeAll(this->fDTDElemNonDeclPool);
  if (toCache) {
    pXVar5 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
    iVar6 = (*src->_vptr_InputSource[5])(src);
    uVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])
                      (pXVar5,CONCAT44(extraout_var,iVar6));
    pXVar5 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
    iVar6 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar8);
    GrammarResolver::orphanGrammar
              ((this->super_XMLScanner).fGrammarResolver,(XMLCh *)XMLUni::fgDTDEntityString);
    iVar9 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable)._vptr_XSerializable[0x16])
                      ();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x50))
              ((long *)CONCAT44(extraout_var_00,iVar9),iVar6);
    GrammarResolver::putGrammar
              ((this->super_XMLScanner).fGrammarResolver,(this->super_XMLScanner).fGrammar);
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  reader = ReaderMgr::createReader
                     (this_00,src,false,RefFrom_NonLiteral,Type_General,Source_External,
                      (this->super_XMLScanner).fCalculateSrcOfs,
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader != (XMLReader *)0x0) {
    builtin_memcpy(gDTDStr,L"DTD",8);
    this_01 = (DTDEntityDecl *)XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
    DTDEntityDecl::DTDEntityDecl(this_01,gDTDStr,false,(this->super_XMLScanner).fMemoryManager);
    iVar6 = (*src->_vptr_InputSource[5])(src);
    XMLEntityDecl::setSystemId((XMLEntityDecl *)this_01,(XMLCh *)CONCAT44(extraout_var_01,iVar6));
    (this_01->super_XMLEntityDecl).fIsExternal = true;
    reader->fThrowAtEnd = true;
    ReaderMgr::pushReaderAdoptEntity(this_00,reader,(XMLEntityDecl *)this_01,true);
    if ((this->super_XMLScanner).fDocTypeHandler == (DocTypeHandler *)0x0) {
      pDVar11 = (DocTypeHandler *)0x0;
    }
    else {
      this_02 = (DTDElementDecl *)
                XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      DTDElementDecl::DTDElementDecl
                (this_02,gDTDStr,(this->super_XMLScanner).fEmptyNamespaceId,Any,
                 (this->super_XMLScanner).fGrammarPoolMemoryManager);
      (this_02->super_XMLElementDecl).fCreateReason = AsRootElem;
      (this_02->super_XMLElementDecl).fExternalElement = true;
      pDVar11 = (this->super_XMLScanner).fDocTypeHandler;
      iVar6 = (*src->_vptr_InputSource[4])(src);
      iVar9 = (*src->_vptr_InputSource[5])(src);
      (*pDVar11->_vptr_DocTypeHandler[4])
                (pDVar11,this_02,CONCAT44(extraout_var_02,iVar6),CONCAT44(extraout_var_03,iVar9),0,1
                );
      (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(this_02);
      pDVar11 = (this->super_XMLScanner).fDocTypeHandler;
    }
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,pDVar11,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo
              (&dtdScanner,&this->super_XMLScanner,this_00,&(this->super_XMLScanner).fBufMgr);
    DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
    if ((this->super_XMLScanner).fValidate == true) {
      pXVar1 = (this->super_XMLScanner).fValidator;
      (*pXVar1->_vptr_XMLValidator[4])(pXVar1,0,1);
    }
    if (toCache) {
      GrammarResolver::cacheGrammars((this->super_XMLScanner).fGrammarResolver);
    }
    pDVar10 = this->fDTDGrammar;
    DTDScanner::~DTDScanner(&dtdScanner);
    return &pDVar10->super_Grammar;
  }
  iVar6 = (*src->_vptr_InputSource[6])(src);
  this_03 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if ((char)iVar6 == '\0') {
    iVar6 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_03,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0xc10,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_05,iVar6),
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  else {
    iVar6 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_03,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0xc0e,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var_04,iVar6),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
LAB_002a9836:
  __cxa_throw(this_03,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

Grammar* IGXMLScanner::loadDTDGrammar(const InputSource& src,
                                      const bool toCache)
{
    // Reset the validators
    fDTDValidator->reset();
    if (fValidatorFromUser)
        fValidator->reset();

    if (!fValidator->handlesDTD()) {
        if (fValidatorFromUser && fValidate)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
        else {
            fValidator = fDTDValidator;
        }
    }

    fDTDGrammar = (DTDGrammar*) fGrammarResolver->getGrammar(XMLUni::fgDTDEntityString);

    if (fDTDGrammar) {
        fDTDGrammar->reset();
    }
    else {
        fDTDGrammar = new (fGrammarPoolMemoryManager) DTDGrammar(fGrammarPoolMemoryManager);
        fGrammarResolver->putGrammar(fDTDGrammar);
    }

    fGrammar = fDTDGrammar;
    fGrammarType = fGrammar->getGrammarType();
    fValidator->setGrammar(fGrammar);

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();
    // and clear out the darned undeclared DTD element pool...
    fDTDElemNonDeclPool->removeAll();

    if (toCache) {

        unsigned int sysId = fGrammarResolver->getStringPool()->addOrFind(src.getSystemId());
        const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(sysId);

        fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
        ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
        fGrammarResolver->putGrammar(fGrammar);
    }

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , false
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );
    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    //  In order to make the processing work consistently, we have to
    //  make this look like an external entity. So create an entity
    //  decl and fill it in and push it with the reader, as happens
    //  with an external entity. Put a janitor on it to insure it gets
    //  cleaned up. The reader manager does not adopt them.
    const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
    DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
    declDTD->setSystemId(src.getSystemId());
    declDTD->setIsExternal(true);

    // Mark this one as a throw at end
    newReader->setThrowAtEnd(true);

    // And push it onto the stack, with its pseudo name
    fReaderMgr.pushReaderAdoptEntity(newReader, declDTD);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler) {

        // Create a dummy root
        DTDElementDecl* rootDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            gDTDStr
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
        rootDecl->setExternalElemDeclaration(true);
        Janitor<DTDElementDecl> janSrc(rootDecl);

        fDocTypeHandler->doctypeDecl(*rootDecl, src.getPublicId(), src.getSystemId(), false, true);
    }

    // Create DTDScanner
    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    // Tell it its not in an include section
    dtdScanner.scanExtSubsetDecl(false, true);

    if (fValidate) {
        //  validate the DTD scan so far
        fValidator->preContentValidation(false, true);
    }

    if (toCache)
        fGrammarResolver->cacheGrammars();

    return fDTDGrammar;
}